

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpositer.cpp
# Opt level: O0

void __thiscall
icu_63::FieldPositionIterator::FieldPositionIterator
          (FieldPositionIterator *this,FieldPositionIterator *rhs)

{
  UVector32 *this_00;
  UVector32 *local_50;
  UErrorCode local_1c;
  FieldPositionIterator *pFStack_18;
  UErrorCode status;
  FieldPositionIterator *rhs_local;
  FieldPositionIterator *this_local;
  
  pFStack_18 = rhs;
  rhs_local = this;
  UObject::UObject(&this->super_UObject,&rhs->super_UObject);
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__FieldPositionIterator_0049e0e8;
  this->data = (UVector32 *)0x0;
  this->pos = pFStack_18->pos;
  if (pFStack_18->data != (UVector32 *)0x0) {
    local_1c = U_ZERO_ERROR;
    this_00 = (UVector32 *)UMemory::operator_new((UMemory *)0x20,(size_t)rhs);
    local_50 = (UVector32 *)0x0;
    if (this_00 != (UVector32 *)0x0) {
      UVector32::UVector32(this_00,&local_1c);
      local_50 = this_00;
    }
    this->data = local_50;
    UVector32::assign(this->data,pFStack_18->data,&local_1c);
    if (local_1c != U_ZERO_ERROR) {
      if (this->data != (UVector32 *)0x0) {
        (*(this->data->super_UObject)._vptr_UObject[1])();
      }
      this->data = (UVector32 *)0x0;
      this->pos = -1;
    }
  }
  return;
}

Assistant:

FieldPositionIterator::FieldPositionIterator(const FieldPositionIterator &rhs)
  : UObject(rhs), data(NULL), pos(rhs.pos) {

  if (rhs.data) {
    UErrorCode status = U_ZERO_ERROR;
    data = new UVector32(status);
    data->assign(*rhs.data, status);
    if (status != U_ZERO_ERROR) {
      delete data;
      data = NULL;
      pos = -1;
    }
  }
}